

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_wrapper.hpp
# Opt level: O2

double convert<double>(char *str)

{
  allocator local_31;
  double local_30;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,str,&local_31);
  local_30 = std::__cxx11::stod(&local_28,(size_t *)0x0);
  std::__cxx11::string::~string((string *)&local_28);
  return local_30;
}

Assistant:

inline double convert<double>(const char* str) { return std::stod(str); }